

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

bool __thiscall TSMuxer::muxPacket(TSMuxer *this,AVPacket *avPacket)

{
  int *__k;
  map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  *this_00;
  pointer plVar1;
  TSMuxer *pTVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  mapped_type_conflict2 *pmVar6;
  mapped_type *pmVar7;
  longlong lVar8;
  byte *pbVar9;
  ostream *this_01;
  undefined4 *puVar10;
  byte pesStreamID;
  int iVar11;
  long lVar12;
  int64_t iVar13;
  int tsIndex;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  ostringstream ss;
  
  if (avPacket->data == (uint8_t *)0x0) {
    return true;
  }
  if (avPacket->size == 0) {
    return true;
  }
  if (avPacket->stream_index == this->m_mainStreamIndex) {
    if ((avPacket->codec != (BaseAbstractStreamReader *)0x0) &&
       (lVar4 = __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                               &MPEGStreamReader::typeinfo,0), lVar4 != 0)) {
      this->m_additionCLPISize = (long)(5292000000.0 / *(double *)(lVar4 + 0x88));
    }
    plVar1 = (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = plVar1[-1];
    lVar12 = 0;
    if (0 < avPacket->duration) {
      lVar12 = avPacket->duration;
    }
    lVar12 = lVar12 + avPacket->pts;
    if (lVar12 < lVar4) {
      lVar12 = lVar4;
    }
    plVar1[-1] = lVar12;
  }
  plVar1 = (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar1[-1] == -1) {
    lVar4 = avPacket->pts;
    this->m_curFileStartPts = lVar4;
    lVar5 = (lVar4 / 0xe5b0 + this->m_timeOffset) - this->m_vbvLen;
    lVar12 = 0;
    if (0 < lVar5) {
      lVar12 = lVar5;
    }
    this->m_fixed_pcr_offset = lVar12;
    this->m_prevM2TSPCR = lVar12 * 300 + -30000;
    plVar1[-1] = lVar4;
  }
  if (this->m_pcr_delta == -1) {
    this->m_pcr_delta = 7000;
    iVar11 = 0x57e4;
    if (this->m_m2tsMode != false) {
      iVar11 = 7000;
    }
    this->m_patPmtDelta = iVar11;
  }
  __k = &avPacket->stream_index;
  if (this->m_minDts == -1) {
    this->m_minDts = avPacket->dts;
  }
  pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_extIndexToTSIndex,__k);
  tsIndex = *pmVar6;
  if (tsIndex == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    this_01 = std::operator<<((ostream *)&ss,"Unknown track number ");
    std::ostream::operator<<(this_01,*__k);
    puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar10 = 200;
    *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
    if (local_1c8 == &local_1b8) {
      *(ulong *)(puVar10 + 6) = CONCAT71(uStack_1b7,local_1b8);
      *(undefined8 *)(puVar10 + 8) = uStack_1b0;
    }
    else {
      *(undefined1 **)(puVar10 + 2) = local_1c8;
      *(ulong *)(puVar10 + 6) = CONCAT71(uStack_1b7,local_1b8);
    }
    *(undefined8 *)(puVar10 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = 0;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  lVar4 = avPacket->dts;
  lVar12 = (lVar4 - this->m_minDts) / 0xe5b0 + this->m_fixed_pcr_offset;
  if (this->m_lastPCR == -1) {
    writePATPMT(this,lVar12,true);
    writePCR(this,lVar12);
    lVar4 = avPacket->dts;
  }
  this_00 = &this->m_streamInfo;
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&tsIndex);
  if ((((lVar4 == pmVar7->m_dts) &&
       (lVar4 = avPacket->pts,
       pmVar7 = std::
                map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
                ::operator[](this_00,&tsIndex), lVar4 == pmVar7->m_pts)) &&
      (tsIndex == this->m_lastTSIndex)) && ((avPacket->flags & 4) == 0)) {
    bVar3 = false;
  }
  else {
    writePESPacket(this);
    bVar3 = true;
  }
  this->m_lastTSIndex = tsIndex;
  if (((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) &&
     (lVar8 = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                      (double)this->m_cbrBitrate), lVar12 <= lVar8)) {
    lVar12 = lVar8;
  }
  if ((bVar3) && (this->m_canSwithBlock == true)) {
    bVar3 = isSplitPoint(this,avPacket);
    if (bVar3) {
      iVar13 = avPacket->pts;
      bVar3 = true;
    }
    else {
      lVar4 = (long)(this->super_AbstractMuxer).m_interliaveBlockSize;
      if ((lVar4 < 1) ||
         ((this->m_processedBlockSize < lVar4 &&
          ((pTVar2 = this->m_sublingMuxer, pTVar2 == (TSMuxer *)0x0 ||
           (pTVar2->m_processedBlockSize < (long)(pTVar2->super_AbstractMuxer).m_interliaveBlockSize
           )))))) goto LAB_001e0914;
      iVar13 = avPacket->pts;
      bVar3 = false;
    }
    finishFileBlock(this,iVar13,lVar12,bVar3,true);
  }
  else {
LAB_001e0914:
    if (((long)this->m_pcr_delta <= lVar12 - this->m_lastPCR) &&
       (((this->super_AbstractMuxer).m_interliaveBlockSize == 0 || (*__k == this->m_mainStreamIndex)
        ))) {
      writePATPMT(this,lVar12,false);
      writePCR(this,lVar12);
    }
  }
  iVar13 = avPacket->pts;
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&tsIndex);
  pmVar7->m_pts = iVar13;
  iVar13 = avPacket->dts;
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&tsIndex);
  pmVar7->m_dts = iVar13;
  pbVar9 = std::
           map<int,_unsigned_char,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>
           ::operator[](&this->m_pesType,&tsIndex);
  pesStreamID = this->m_useNewStyleAudioPES << 6 | 0xbd;
  if (0xb9 < *pbVar9) {
    pesStreamID = *pbVar9;
  }
  addData(this,pesStreamID,tsIndex,avPacket);
  if (avPacket->codec == (BaseAbstractStreamReader *)0x0) {
    lVar4 = avPacket->duration;
    if (lVar4 < 1) {
LAB_001e0a18:
      lVar4 = avPacket->dts;
      goto LAB_001e0a1c;
    }
  }
  else {
    lVar12 = __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                            &MPEGStreamReader::typeinfo,0);
    lVar4 = avPacket->duration;
    if (lVar4 < 1) {
      if (lVar12 == 0) goto LAB_001e0a18;
      lVar4 = (long)(5292000000.0 / *(double *)(lVar12 + 0x88));
    }
  }
  lVar4 = lVar4 + avPacket->dts;
LAB_001e0a1c:
  this->m_endStreamDTS = lVar4;
  return true;
}

Assistant:

bool TSMuxer::muxPacket(AVPacket& avPacket)
{
    if (avPacket.data == nullptr || avPacket.size == 0)
    {
        return true;
    }

#ifdef _DEBUG
    // assert (avPacket.dts >= m_lastProcessedDts);
    m_lastProcessedDts = avPacket.dts;
    m_lastStreamIndex = avPacket.stream_index;
#endif

    if (avPacket.stream_index == m_mainStreamIndex)
    {
        const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
        if (mpegReader)
            m_additionCLPISize = static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());

        if (avPacket.duration > 0)
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts + avPacket.duration);
        else
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts);
    }
    if (m_firstPts[m_firstPts.size() - 1] == -1 /*|| avPacket.pts < m_firstPts[m_firstPts.size()-1]*/)
    {
        if (m_firstPts[m_firstPts.size() - 1] == -1)
        {
            m_curFileStartPts = avPacket.pts;
            const int64_t firstPtsShift = internalClockToPts(avPacket.pts);
            m_fixed_pcr_offset = m_timeOffset - m_vbvLen + firstPtsShift;
            if (m_fixed_pcr_offset < 0)
                m_fixed_pcr_offset = 0;
            m_prevM2TSPCR = (m_fixed_pcr_offset - 100) *
                            300;  // add a little extra delta (100) to prevent 0 bitrate for first several packets
        }
        m_firstPts[m_firstPts.size() - 1] = avPacket.pts;
    }

    if (m_pcr_delta == -1)
    {
        if (m_cbrBitrate != -1)
            m_pcr_delta = M_CBR_PCR_DELTA;
        else
            m_pcr_delta = M_PCR_DELTA;
        m_patPmtDelta = m_m2tsMode ? M_PCR_DELTA : PCR_FREQUENCY / 4;
    }

    if (m_minDts == -1)
        m_minDts = avPacket.dts;

    const int tsIndex = m_extIndexToTSIndex[avPacket.stream_index];
    if (tsIndex == 0)
        THROW(ERR_TS_COMMON, "Unknown track number " << avPacket.stream_index)

    auto newPCR = (avPacket.dts - m_minDts) / INT_FREQ_TO_TS_FREQ + m_fixed_pcr_offset;
    if (m_lastPCR == -1)
    {
        writePATPMT(newPCR, true);
        writePCR(newPCR);
    }

    bool newPES = false;
    if (avPacket.dts != m_streamInfo[tsIndex].m_dts || avPacket.pts != m_streamInfo[tsIndex].m_pts ||
        tsIndex != m_lastTSIndex || avPacket.flags & AVPacket::FORCE_NEW_FRAME)
    {
        writePESPacket();
        newPES = true;
    }

    m_lastTSIndex = tsIndex;

    if (m_cbrBitrate != -1 && m_lastPCR != -1)
    {
        const auto cbrPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
        newPCR = FFMAX(newPCR, cbrPCR);
    }

    if (newPES && m_canSwithBlock && isSplitPoint(avPacket))
    {
        finishFileBlock(avPacket.pts, newPCR, true);  // goto next file
    }
    else if (newPES && m_interliaveBlockSize > 0 && m_canSwithBlock &&
             (blockFull() || (m_sublingMuxer && m_sublingMuxer->blockFull())))
    {
        finishFileBlock(avPacket.pts, newPCR, false);  // interleave SSIF here
    }
    else if (newPCR - m_lastPCR >= m_pcr_delta)
    {
        if (m_interliaveBlockSize == 0 || avPacket.stream_index == m_mainStreamIndex)
        {
            writePATPMT(newPCR);
            writePCR(newPCR);
        }
    }

    m_streamInfo[tsIndex].m_pts = avPacket.pts;
    m_streamInfo[tsIndex].m_dts = avPacket.dts;
    uint8_t pesStreamID = m_pesType[tsIndex];
    if (pesStreamID <= SYSTEM_START_CODE)
    {
        if (m_useNewStyleAudioPES)
            pesStreamID = PES_VC1_ID;
        else
            pesStreamID = PES_PRIVATE_DATA1;
    }

    addData(pesStreamID, tsIndex, avPacket);

    const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
    if (avPacket.duration > 0)
        m_endStreamDTS = avPacket.dts + avPacket.duration;
    else if (mpegReader)
        m_endStreamDTS = avPacket.dts + static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());
    else
        m_endStreamDTS = avPacket.dts;

    return true;
}